

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void hatch_egg(void *arg,long timeout)

{
  char cVar1;
  level *lev;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  char *local_268;
  char local_248 [6];
  boolean redraw;
  boolean siblings;
  char carriedby [256];
  char monnambuf [256];
  int hatchcount;
  int mnum;
  int i;
  boolean cansee_hatchspot;
  boolean knows_egg;
  boolean silent;
  boolean yours;
  xchar y;
  xchar x;
  coord cc;
  monst *mon2;
  monst *mon;
  obj *egg;
  long timeout_local;
  void *arg_local;
  
  bVar2 = false;
  bVar3 = false;
  monnambuf[0xfc] = '\0';
  monnambuf[0xfd] = '\0';
  monnambuf[0xfe] = '\0';
  monnambuf[0xff] = '\0';
  if (*(int *)((long)arg + 0x50) == -1) {
    return;
  }
  _cansee_hatchspot = (monst *)0x0;
  mon2 = (monst *)0x0;
  iVar6 = big_to_little(*(int *)((long)arg + 0x50));
  bVar12 = true;
  if (((*(char *)((long)arg + 0x34) == '\0') && (bVar12 = false, flags.female == '\0')) &&
     (bVar12 = false, *(char *)((long)arg + 0x48) == '\x03')) {
    iVar7 = rn2(2);
    bVar12 = iVar7 == 0;
  }
  uVar10 = (ulong)moves;
  bVar5 = get_obj_location((obj *)arg,(xchar *)((long)&i + 1),(xchar *)&i,0);
  if (bVar5 != '\0') {
    monnambuf._252_4_ = rnd(*(int *)((long)arg + 0x30));
    bVar3 = (viz_array[(char)i][i._1_1_] & 2U) != 0 && timeout == uVar10;
    if (((mons[iVar6].geno & 0x1000) == 0) &&
       (hatchcount = monnambuf._252_4_, (mvitals[iVar6].mvflags & 3) == 0)) {
      while ((0 < hatchcount &&
             ((bVar5 = enexto((coord *)((long)&i + 2),level,i._1_1_,(char)i,mons + iVar6),
              bVar5 != '\0' &&
              (mon2 = makemon(mons + iVar6,level,(int)i._2_1_,(int)i._3_1_,1), mon2 != (monst *)0x0)
              )))) {
        if ((((bVar12) && (timeout == uVar10)) ||
            ((*(char *)((long)arg + 0x48) == '\x03' && (mon2->data->mlet == '\x1e')))) &&
           ((_cansee_hatchspot = tamedog(mon2,(obj *)0x0), _cansee_hatchspot != (monst *)0x0 &&
            ((mon2 = _cansee_hatchspot, *(char *)((long)arg + 0x48) == '\x03' &&
             (_cansee_hatchspot->data->mlet != '\x1e')))))) {
          _cansee_hatchspot->mtame = '\x14';
        }
        if ((mvitals[iVar6].mvflags & 1) != 0) break;
        _cansee_hatchspot = mon2;
        hatchcount = hatchcount + -1;
      }
      if (mon2 == (monst *)0x0) {
        mon2 = _cansee_hatchspot;
      }
      monnambuf._252_4_ = monnambuf._252_4_ - hatchcount;
      *(int *)((long)arg + 0x30) = *(int *)((long)arg + 0x30) - monnambuf._252_4_;
    }
  }
  if (mon2 == (monst *)0x0) {
    return;
  }
  bVar4 = false;
  if (bVar3) {
    pcVar8 = "";
    if (1 < (int)monnambuf._252_4_) {
      pcVar8 = "some ";
      pcVar9 = m_monnam(mon2);
      local_268 = makeplural(pcVar9);
    }
    else {
      pcVar9 = m_monnam(mon2);
      local_268 = an(pcVar9);
    }
    sprintf(carriedby + 0xf8,"%s%s",pcVar8,local_268);
  }
  cVar1 = *(char *)((long)arg + 0x48);
  if (cVar1 == '\x01') {
    bVar2 = bVar3;
    bVar4 = bVar3;
    if (bVar3) {
      pline("You see %s hatch.",carriedby + 0xf8);
    }
    goto LAB_00300bb1;
  }
  if (cVar1 == '\x03') {
    bVar2 = true;
    if (bVar3) {
      pcVar8 = locomotion(mon2->data,"drop");
      pline("You see %s %s out of your pack!",carriedby + 0xf8,pcVar8);
    }
    else {
      pcVar8 = locomotion(mon2->data,"drop");
      pline("You feel something %s from your pack!",pcVar8);
    }
    if (bVar12) {
      pcVar8 = "Its";
      if (1 < (int)monnambuf._252_4_) {
        pcVar8 = "Their";
      }
      pcVar9 = "daddy";
      if (flags.female != '\0') {
        pcVar9 = "mommy";
      }
      pcVar11 = "?";
      if (*(char *)((long)arg + 0x34) != '\0') {
        pcVar11 = ".";
      }
      pline("%s cries sound like \"%s%s\"",pcVar8,pcVar9,pcVar11);
    }
    else if (mon2->data->mlet == '\x1e') {
      verbalize("Gleep!");
    }
    goto LAB_00300bb1;
  }
  if (cVar1 != '\x04') {
    warning("egg hatched where? (%d)",(ulong)(uint)(int)*(char *)((long)arg + 0x48));
    goto LAB_00300bb1;
  }
  if (!bVar3) goto LAB_00300bb1;
  if (*(char *)(*(long *)((long)arg + 8) + 0x65) == '\0') {
    if (((viz_array[*(char *)(*(long *)((long)arg + 8) + 0x50)]
          [*(char *)(*(long *)((long)arg + 8) + 0x4f)] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((*(ushort *)(*(long *)(*(long *)((long)arg + 8) + 8) + 0x38) & 0x200) != 0 &&
         ((viz_array[*(char *)(*(long *)((long)arg + 8) + 0x50)]
           [*(char *)(*(long *)((long)arg + 8) + 0x4f)] & 1U) != 0)))))) goto LAB_00300a31;
LAB_00300b0b:
    bVar5 = is_pool(level,(int)mon2->mx,(int)mon2->my);
    if (bVar5 == '\0') {
      strcpy(local_248,"thin air");
    }
    else {
      strcpy(local_248,"empty water");
    }
  }
  else {
    bVar5 = worm_known(level,*(monst **)((long)arg + 8));
    if (bVar5 == '\0') goto LAB_00300b0b;
LAB_00300a31:
    if ((((((*(uint *)(*(long *)((long)arg + 8) + 0x60) >> 1 & 1) != 0) &&
          (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) &&
        (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)(*(long *)((long)arg + 8) + 0x60) >> 7 & 1) != 0 ||
         ((*(uint *)(*(long *)((long)arg + 8) + 0x60) >> 9 & 1) != 0)) ||
        (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_00300b0b;
    pcVar8 = a_monnam(*(monst **)((long)arg + 8));
    pcVar8 = s_suffix(pcVar8);
    sprintf(local_248,"%s pack",pcVar8);
    bVar2 = true;
  }
  pcVar8 = locomotion(mon2->data,"drop");
  pline("You see %s %s out of %s!",carriedby + 0xf8,pcVar8,local_248);
LAB_00300bb1:
  if ((bVar3) && (bVar2)) {
    learn_egg_type(iVar6);
  }
  if (*(int *)((long)arg + 0x30) < 1) {
    if (*(char *)((long)arg + 0x48) == '\x03') {
      useup((obj *)arg);
    }
    else {
      obj_extract_self((obj *)arg);
      obfree((obj *)arg,(obj *)0x0);
    }
  }
  else {
    attach_egg_hatch_timeout((obj *)arg);
    if (*(char *)((long)arg + 0x49) != '\0') {
      stop_timer(*(level **)((long)arg + 0x20),4,arg);
      lev = *(level **)((long)arg + 0x20);
      iVar6 = rnd(0xc);
      start_timer(lev,(long)iVar6,2,4,arg);
    }
  }
  if (bVar4) {
    newsym((int)i._1_1_,(int)(char)i);
  }
  return;
}

Assistant:

void hatch_egg(void *arg, long timeout)
{
	struct obj *egg;
	struct monst *mon, *mon2;
	coord cc;
	xchar x, y;
	boolean yours, silent, knows_egg = FALSE;
	boolean cansee_hatchspot = FALSE;
	int i, mnum, hatchcount = 0;

	egg = (struct obj *) arg;
	/* sterilized while waiting */
	if (egg->corpsenm == NON_PM) return;

	mon = mon2 = NULL;
	mnum = big_to_little(egg->corpsenm);
	/* The identity of one's father is learned, not innate */
	yours = (egg->spe || (!flags.female && carried(egg) && !rn2(2)));
	silent = (timeout != moves);	/* hatched while away */

	/* only can hatch when in INVENT, FLOOR, MINVENT */
	if (get_obj_location(egg, &x, &y, 0)) {
	    hatchcount = rnd((int)egg->quan);
	    cansee_hatchspot = cansee(x, y) && !silent;
	    if (!(mons[mnum].geno & G_UNIQ) &&
		   !(mvitals[mnum].mvflags & (G_GENOD | G_EXTINCT))) {
		for (i = hatchcount; i > 0; i--) {
		    if (!enexto(&cc, level, x, y, &mons[mnum]) ||
			 !(mon = makemon(&mons[mnum], level, cc.x, cc.y, NO_MINVENT)))
			break;
		    /* tame if your own egg hatches while you're on the
		       same dungeon level, or any dragon egg which hatches
		       while it's in your inventory */
		    if ((yours && !silent) ||
			(carried(egg) && mon->data->mlet == S_DRAGON)) {
			if ((mon2 = tamedog(mon, NULL)) != 0) {
			    mon = mon2;
			    if (carried(egg) && mon->data->mlet != S_DRAGON)
				mon->mtame = 20;
			}
		    }
		    if (mvitals[mnum].mvflags & G_EXTINCT)
			break;	/* just made last one */
		    mon2 = mon;	/* in case makemon() fails on 2nd egg */
		}
		if (!mon) mon = mon2;
		hatchcount -= i;
		egg->quan -= (long)hatchcount;
	    }
	}

	if (mon) {
	    char monnambuf[BUFSZ], carriedby[BUFSZ];
	    boolean siblings = (hatchcount > 1), redraw = FALSE;

	    if (cansee_hatchspot) {
		sprintf(monnambuf, "%s%s",
			siblings ? "some " : "",
			siblings ?
			makeplural(m_monnam(mon)) : an(m_monnam(mon)));
		/* we don't learn the egg type here because learning
		   an egg type requires either seeing the egg hatch
		   or being familiar with the egg already,
		   as well as being able to see the resulting
		   monster, checked below
		*/
	    }
	    switch (egg->where) {
		case OBJ_INVENT:
		    knows_egg = TRUE; /* true even if you are blind */
		    if (!cansee_hatchspot)
			pline("You feel something %s from your pack!",
			    locomotion(mon->data, "drop"));
		    else
			pline("You see %s %s out of your pack!",
			    monnambuf, locomotion(mon->data, "drop"));
		    if (yours) {
			pline("%s cries sound like \"%s%s\"",
			    siblings ? "Their" : "Its",
			    flags.female ? "mommy" : "daddy",
			    egg->spe ? "." : "?");
		    } else if (mon->data->mlet == S_DRAGON) {
			verbalize("Gleep!");		/* Mything eggs :-) */
		    }
		    break;

		case OBJ_FLOOR:
		    if (cansee_hatchspot) {
			knows_egg = TRUE;
			pline("You see %s hatch.", monnambuf);
			redraw = TRUE;	/* update egg's map location */
		    }
		    break;

		case OBJ_MINVENT:
		    if (cansee_hatchspot) {
			/* egg carring monster might be invisible */
			if (canseemon(level, egg->ocarry)) {
			    sprintf(carriedby, "%s pack",
				     s_suffix(a_monnam(egg->ocarry)));
			    knows_egg = TRUE;
			}
			else if (is_pool(level, mon->mx, mon->my))
			    strcpy(carriedby, "empty water");
			else
			    strcpy(carriedby, "thin air");
			pline("You see %s %s out of %s!", monnambuf,
			    locomotion(mon->data, "drop"), carriedby);
		    }
		    break;
		default:
		    warning("egg hatched where? (%d)", (int)egg->where);
		    break;
	    }

	    if (cansee_hatchspot && knows_egg)
		learn_egg_type(mnum);

	    if (egg->quan > 0) {
		/* still some eggs left */
		attach_egg_hatch_timeout(egg);
		if (egg->timed) {
		    /* replace ordinary egg timeout with a short one */
		    stop_timer(egg->olev, HATCH_EGG, egg);
		    start_timer(egg->olev, (long)rnd(12), TIMER_OBJECT,
					HATCH_EGG, egg);
		}
	    } else if (carried(egg)) {
		useup(egg);
	    } else {
		/* free egg here because we use it above */
		obj_extract_self(egg);
		obfree(egg, NULL);
	    }
	    if (redraw) newsym(x, y);
	}
}